

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int jsonFuncArgMightBeBinary(sqlite3_value *pJson)

{
  byte bVar1;
  uint uVar2;
  u32 uVar3;
  byte *pbVar4;
  uint uVar5;
  u32 sz;
  u32 local_6c;
  JsonParse local_68;
  
  uVar2._0_2_ = pJson->flags;
  uVar2._2_1_ = pJson->enc;
  uVar2._3_1_ = pJson->eSubtype;
  uVar5 = 0;
  if ((0x1000000010001U >> ((ulong)uVar2 & 0x3f) & 1) != 0) {
    pbVar4 = (byte *)sqlite3_value_blob(pJson);
    uVar2 = sqlite3ValueBytes(pJson,'\x01');
    uVar5 = 0;
    if ((pbVar4 != (byte *)0x0 && 0 < (int)uVar2) && (bVar1 = *pbVar4, (bVar1 & 0xf) < 0xd)) {
      local_68.zJson = (char *)0x0;
      local_68.nIns = 0;
      local_68.iLabel = 0;
      local_68.aIns = (u8 *)0x0;
      local_68.iErr = 0;
      local_68.iDepth = 0;
      local_68.nErr = '\0';
      local_68.oom = '\0';
      local_68.bJsonIsRCStr = '\0';
      local_68.hasNonstd = '\0';
      local_68.bReadOnly = '\0';
      local_68.eEdit = '\0';
      local_68.delta = 0;
      local_68.db = (sqlite3 *)0x0;
      local_68.nJson = 0;
      local_68.nJPRef = 0;
      local_68.nBlobAlloc = 0;
      local_68.nBlob = uVar2;
      uVar5 = 0;
      local_68.aBlob = pbVar4;
      uVar3 = jsonbPayloadSize(&local_68,0,&local_6c);
      if ((uVar3 != 0) && (uVar3 + local_6c == uVar2)) {
        uVar5 = (uint)(local_6c == 0 || 2 < (bVar1 & 0xf));
      }
    }
  }
  return uVar5;
}

Assistant:

static int jsonFuncArgMightBeBinary(sqlite3_value *pJson){
  u32 sz, n;
  const u8 *aBlob;
  int nBlob;
  JsonParse s;
  if( sqlite3_value_type(pJson)!=SQLITE_BLOB ) return 0;
  aBlob = sqlite3_value_blob(pJson);
  nBlob = sqlite3_value_bytes(pJson);
  if( nBlob<1 ) return 0;
  if( NEVER(aBlob==0) || (aBlob[0] & 0x0f)>JSONB_OBJECT ) return 0;
  memset(&s, 0, sizeof(s));
  s.aBlob = (u8*)aBlob;
  s.nBlob = nBlob;
  n = jsonbPayloadSize(&s, 0, &sz);
  if( n==0 ) return 0;
  if( sz+n!=(u32)nBlob ) return 0;
  if( (aBlob[0] & 0x0f)<=JSONB_FALSE && sz>0 ) return 0;
  return sz+n==(u32)nBlob;
}